

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

void __thiscall
helics::FederateInfo::loadInfoFromJson(FederateInfo *this,string *jsonString,bool runArgParser)

{
  value_t vVar1;
  json_value jVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  reference this_00;
  size_type sVar6;
  undefined1 local_570 [16];
  json doc;
  shared_ptr<CLI::Config> local_550;
  data local_540;
  istringstream jstringHelicsSub;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_528 [47];
  istringstream jstringHelics;
  istringstream jstring;
  
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(&doc,(nullptr_t)0x0);
  fileops::loadJson((fileops *)&local_540,(string *)jsonString);
  jVar2 = doc.m_data.m_value;
  vVar1 = doc.m_data.m_type;
  doc.m_data.m_type = local_540.m_type;
  local_540.m_type = vVar1;
  doc.m_data.m_value = local_540.m_value;
  local_540.m_value = jVar2;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_540);
  _jstring = &doc;
  loadJsonConfig(this,(JsonBuffer *)&jstring);
  bVar4 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>(&doc,(char (*) [7])0x37115e);
  if (bVar4) {
    this_00 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&doc,"helics");
    bVar5 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[7],_0>(this_00,(char (*) [7])0x37115e);
  }
  else {
    bVar5 = false;
  }
  if (runArgParser) {
    makeCLIApp((FederateInfo *)local_570);
    *(bool *)(local_570._0_8_ + 0x48) = true;
    sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(jsonString,'{',0);
    if (sVar6 == 0xffffffffffffffff) {
      std::ifstream::ifstream(&jstring,(string *)jsonString,_S_in);
      CLI::App::parse_from_stream((App *)local_570._0_8_,(istream *)&jstring);
      if (bVar4) {
        std::ios::clear((int)(istream *)&jstring + (int)_jstring[-2].m_data.m_value.number_integer);
        std::istream::seekg(&jstring,0,0);
        std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                  ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
        _Var3._M_p = _jstringHelicsSub;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jstringHelics,"helics",(allocator<char> *)&local_550);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_Var3._M_p + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &jstringHelics);
        std::__cxx11::string::~string((string *)&jstringHelics);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_528);
        CLI::App::parse_from_stream((App *)local_570._0_8_,(istream *)&jstring);
        if (bVar5 != false) {
          std::ios::clear((int)(istream *)&jstring + (int)_jstring[-2].m_data.m_value.number_integer
                         );
          std::istream::seekg(&jstring,0,0);
          std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                    ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&jstringHelics,"helics.helics",(allocator<char> *)&local_550);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (_jstringHelicsSub + 0x30),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &jstringHelics);
          std::__cxx11::string::~string((string *)&jstringHelics);
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_528);
          CLI::App::parse_from_stream((App *)local_570._0_8_,(istream *)&jstring);
        }
      }
      std::ifstream::~ifstream(&jstring);
    }
    else {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&jstring,(string *)jsonString,_S_in);
      CLI::App::parse_from_stream((App *)local_570._0_8_,(istream *)&jstring);
      if (bVar4) {
        std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                  ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jstringHelics,"helics",(allocator<char> *)&local_550);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_jstringHelicsSub + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &jstringHelics);
        std::__cxx11::string::~string((string *)&jstringHelics);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_528);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&jstringHelics,(string *)jsonString,_S_in);
        CLI::App::parse_from_stream((App *)local_570._0_8_,(istream *)&jstringHelics);
        if (bVar5 != false) {
          std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>(&local_550);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&jstringHelicsSub,"helics.helics",
                     (allocator<char> *)(local_570 + 0xf));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_550.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                     .items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &jstringHelicsSub);
          std::__cxx11::string::~string((string *)&jstringHelicsSub);
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_550.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&jstringHelicsSub,(string *)jsonString,_S_in);
          CLI::App::parse_from_stream((App *)local_570._0_8_,(istream *)&jstringHelicsSub);
          std::__cxx11::istringstream::~istringstream((istringstream *)&jstringHelicsSub);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&jstringHelics);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&jstring);
    }
    if ((App *)local_570._0_8_ != (App *)0x0) {
      (*(*(_func_int ***)local_570._0_8_)[1])();
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&doc.m_data);
  return;
}

Assistant:

void FederateInfo::loadInfoFromJson(const std::string& jsonString, bool runArgParser)
{
    nlohmann::json doc;
    try {
        doc = fileops::loadJson(jsonString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }
    loadJsonConfig(doc);
    const bool hasHelicsSection = doc.contains("helics");
    bool hasHelicsSubSection{false};
    if (hasHelicsSection) {
        hasHelicsSubSection = doc["helics"].contains("helics");
    }
    if (runArgParser) {
        auto app = makeCLIApp();
        app->allow_extras();
        try {
            if (jsonString.find('{') != std::string::npos) {
                std::istringstream jstring(jsonString);
                app->parse_from_stream(jstring);
                if (hasHelicsSection) {
                    app->get_config_formatter_base()->section("helics");
                    std::istringstream jstringHelics(jsonString);
                    app->parse_from_stream(jstringHelics);
                    if (hasHelicsSubSection) {
                        app->get_config_formatter_base()->section("helics.helics");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                }
            } else {
                std::ifstream file(jsonString);
                app->parse_from_stream(file);
                if (hasHelicsSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("helics");
                    app->parse_from_stream(file);
                    if (hasHelicsSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.helics");
                        app->parse_from_stream(file);
                    }
                }
            }
        }
        catch (const CLI::Error& clierror) {
            throw(InvalidIdentifier(clierror.what()));
        }
    }
}